

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O3

bool __thiscall
ICM::Compiler::InstructionCreater::createNodeIf(InstructionCreater *this,Node *node,Element *refelt)

{
  InstructionList *this_00;
  undefined8 uVar1;
  iterator __position;
  InstructionData *instdata;
  pointer ppIVar2;
  uint_t uVar3;
  Jump **ppJVar4;
  long lVar5;
  pointer pEVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  vector<ICM::Instruction::Insts::Jump_*,_std::allocator<ICM::Instruction::Insts::Jump_*>_> recordJ;
  Jump *jinst;
  Jump **local_68;
  iterator iStack_60;
  Jump **local_58;
  Node *local_50;
  Jump *local_48;
  Element *local_40;
  Jump *local_38;
  
  pEVar6 = (node->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
           super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>._M_impl
           .super__Vector_impl_data._M_finish;
  uVar8 = (ulong)((long)pEVar6 -
                  (long)(node->
                        super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>)
                        .
                        super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) >> 1;
  local_68 = (Jump **)0x0;
  iStack_60._M_current = (Jump **)0x0;
  local_58 = (Jump **)0x0;
  local_50 = node;
  if (uVar8 != 1) {
    this_00 = &this->InstList;
    lVar5 = uVar8 << 4;
    lVar9 = uVar8 - 1;
    lVar7 = 0x10;
    local_40 = refelt;
    do {
      pEVar6 = (local_50->
               super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>).
               super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
               _M_impl.super__Vector_impl_data._M_start;
      createReferNode(this,(Element *)((long)&pEVar6->field_0 + lVar7));
      instdata = (InstructionData *)operator_new(0x28);
      instdata->_vptr_InstructionData = (_func_int **)0x0;
      *(undefined8 *)&instdata->Inst = 0;
      instdata[1]._vptr_InstructionData = (_func_int **)0x0;
      *(undefined8 *)&instdata[1].Inst = 0;
      instdata[2]._vptr_InstructionData = (_func_int **)0x0;
      instdata->Inst = jmpn;
      instdata->_vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00151e98;
      *(undefined8 *)&instdata[1].Inst = 0;
      uVar1 = *(undefined8 *)((long)&pEVar6->index + lVar7);
      *(undefined4 *)&instdata[1]._vptr_InstructionData =
           *(undefined4 *)((long)&pEVar6->field_0 + lVar7);
      *(undefined8 *)&instdata[1].Inst = uVar1;
      Instruction::InstructionList::push(this_00,instdata);
      createReferNode(this,(Element *)((long)&pEVar6->field_0 + lVar5));
      local_48 = (Jump *)operator_new(0x18);
      (local_48->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.
      _vptr_InstructionData = (_func_int **)0x0;
      *(undefined8 *)
       &(local_48->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.Inst
           = 0;
      local_48->Index = 0;
      (local_48->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.Inst =
           jump;
      (local_48->super_InstDataBase<(ICM::Instruction::Instruction)30>).super_InstructionData.
      _vptr_InstructionData = (_func_int **)&PTR_getToString_abi_cxx11__00151e50;
      if (iStack_60._M_current == local_58) {
        std::vector<ICM::Instruction::Insts::Jump*,std::allocator<ICM::Instruction::Insts::Jump*>>::
        _M_realloc_insert<ICM::Instruction::Insts::Jump*const&>
                  ((vector<ICM::Instruction::Insts::Jump*,std::allocator<ICM::Instruction::Insts::Jump*>>
                    *)&local_68,iStack_60,&local_48);
      }
      else {
        *iStack_60._M_current = local_48;
        iStack_60._M_current = iStack_60._M_current + 1;
      }
      local_38 = local_48;
      __position._M_current =
           (this->InstList).
           super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
           .
           super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->InstList).
          super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
          .
          super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>
        ::_M_realloc_insert<ICM::Instruction::InstructionData*>
                  ((vector<ICM::Instruction::InstructionData*,std::allocator<ICM::Instruction::InstructionData*>>
                    *)this_00,__position,(InstructionData **)&local_38);
        ppIVar2 = (this->InstList).
                  super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                  .
                  super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        *__position._M_current = (InstructionData *)local_48;
        ppIVar2 = (this->InstList).
                  super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                  .
                  super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish + 1;
        (this->InstList).
        super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
        .
        super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
        ._M_impl.super__Vector_impl_data._M_finish = ppIVar2;
      }
      instdata[2]._vptr_InstructionData =
           (_func_int **)
           ((long)ppIVar2 -
            (long)(this_00->
                  super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                  ).
                  super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
      lVar5 = lVar5 + 0x10;
      lVar7 = lVar7 + 0x10;
      lVar9 = lVar9 + -1;
    } while (lVar9 != 0);
    pEVar6 = (local_50->super_vector<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>)
             .super__Vector_base<ICM::ASTBase::Element,_std::allocator<ICM::ASTBase::Element>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    refelt = local_40;
  }
  createReferNode(this,pEVar6 + -1);
  Instruction::InstructionList::push(&this->InstList,sing);
  uVar3 = ((long)(this->InstList).
                 super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                 .
                 super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->InstList).
                 super_vector<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                 .
                 super__Vector_base<ICM::Instruction::InstructionData_*,_std::allocator<ICM::Instruction::InstructionData_*>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) - 1;
  for (ppJVar4 = local_68; ppJVar4 != iStack_60._M_current; ppJVar4 = ppJVar4 + 1) {
    (*ppJVar4)->Index = uVar3;
  }
  if ((refelt->field_0).field_0.etype == '\x02') {
    refelt->index = uVar3;
    if (local_68 != (Jump **)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
    return true;
  }
  __assert_fail("isRefer()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/include/parser/ast.h"
                ,0x34,"void ICM::ASTBase::Element::setRefer(size_t)");
}

Assistant:

bool createNodeIf(Node &node, Element &refelt) {
				size_t count = node.size() / 2 - 1;
				vector<Insts::Jump*> recordJ;
				for (size_t i : range(1, 1 + count)) {
					Element &be = node[i];
					Element &de = node[i + count];

					createReferNode(be);
					auto *inst = new Insts::JumpNot();
					inst->Data = ConvertToInstElement(be);
					InstList.push(inst);
					createReferNode(de);
					auto *jinst = new Insts::Jump();
					recordJ.push_back(jinst);
					InstList.push_back(jinst);
					inst->Index = NextInstID();
				}
				createReferNode(node.back());
				InstList.push(sing);
				size_t index = CurrInstID();
				for (auto *p : recordJ) {
					p->Index = index;
				}
				refelt.setRefer(index);
				return true;
			}